

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O1

int __thiscall cmCTestScriptHandler::ExtractVariables(cmCTestScriptHandler *this)

{
  string *dir;
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *pcVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  long *plVar9;
  size_type *psVar10;
  uint uVar11;
  ulong uVar12;
  char updateVar [40];
  string msg;
  char *updateVal;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  string *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  pcVar3 = this->Makefile;
  paVar2 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CTEST_SOURCE_DIRECTORY","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
  dir = &this->SourceDir;
  std::__cxx11::string::_M_assign((string *)dir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CTEST_BINARY_DIRECTORY","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
  std::__cxx11::string::_M_assign((string *)&this->BinaryDir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::AddKeepPath(dir);
  cmsys::SystemTools::AddKeepPath(&this->BinaryDir);
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CTEST_COMMAND","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
  std::__cxx11::string::_M_assign((string *)&this->CTestCmd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CTEST_CVS_CHECKOUT","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
  std::__cxx11::string::_M_assign((string *)&this->CVSCheckOut);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CTEST_DASHBOARD_ROOT","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
  psVar1 = &this->CTestRoot;
  std::__cxx11::string::_M_assign((string *)psVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CTEST_UPDATE_COMMAND","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
  std::__cxx11::string::_M_assign((string *)&this->UpdateCmd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((this->UpdateCmd)._M_string_length == 0) {
    pcVar3 = this->Makefile;
    local_c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CTEST_CVS_COMMAND","");
    cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
    std::__cxx11::string::_M_assign((string *)&this->UpdateCmd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CTEST_ENVIRONMENT","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
  std::__cxx11::string::_M_assign((string *)&this->CTestEnv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CTEST_INITIAL_CACHE","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
  std::__cxx11::string::_M_assign((string *)&this->InitialCache);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CTEST_CMAKE_COMMAND","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
  std::__cxx11::string::_M_assign((string *)&this->CMakeCmd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"CTEST_CMAKE_OUTPUT_FILE_NAME","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
  std::__cxx11::string::_M_assign((string *)&this->CMOutFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CTEST_BACKUP_AND_RESTORE","")
  ;
  bVar5 = cmMakefile::IsOn(pcVar3,&local_c8);
  this->Backup = bVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"CTEST_START_WITH_EMPTY_BINARY_DIRECTORY","");
  bVar5 = cmMakefile::IsOn(pcVar3,&local_c8);
  this->EmptyBinDir = bVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"CTEST_START_WITH_EMPTY_BINARY_DIRECTORY_ONCE","");
  bVar5 = cmMakefile::IsOn(pcVar3,&local_c8);
  this->EmptyBinDirOnce = bVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"CTEST_CONTINUOUS_MINIMUM_INTERVAL","");
  local_40 = cmMakefile::GetDefinition(pcVar3,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"CTEST_CONTINUOUS_DURATION","");
  local_48 = cmMakefile::GetDefinition(pcVar3,&local_c8);
  local_58 = (string *)psVar1;
  local_50 = dir;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  uVar12 = 1;
  do {
    sprintf((char *)&local_c8,"CTEST_EXTRA_UPDATES_%i",uVar12);
    pcVar3 = this->Makefile;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    sVar7 = strlen((char *)&local_c8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,&local_c8,(long)&local_c8._M_dataplus._M_p + sVar7);
    pcVar8 = cmMakefile::GetDefinition(pcVar3,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_38 = pcVar8;
    if (pcVar8 != (char *)0x0) {
      if ((this->UpdateCmd)._M_string_length == 0) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        sVar7 = strlen((char *)&local_c8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,&local_c8,(long)&local_c8._M_dataplus._M_p + sVar7);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_78);
        psVar10 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_98.field_2._M_allocated_capacity = *psVar10;
          local_98.field_2._8_8_ = plVar9[3];
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar10;
          local_98._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_98._M_string_length = plVar9[1];
        *plVar9 = (long)psVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        cmSystemTools::Error(&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        return 0xc;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->ExtraUpdates,&local_38);
    }
    uVar11 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar11;
  } while (uVar11 != 10);
  if ((this->Backup == true) && ((this->CVSCheckOut)._M_string_length == 0)) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Backup was requested without specifying CTEST_CVS_CHECKOUT.","")
    ;
    cmSystemTools::Error(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    iVar6 = 3;
  }
  else {
    paVar2 = &local_98.field_2;
    if (((this->SourceDir)._M_string_length == 0) ||
       (((this->BinaryDir)._M_string_length == 0 || ((this->CTestCmd)._M_string_length == 0)))) {
      local_98._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"CTEST_SOURCE_DIRECTORY = ","");
      std::__cxx11::string::append((char *)&local_98);
      std::__cxx11::string::append((char *)&local_98);
      std::__cxx11::string::append((char *)&local_98);
      std::__cxx11::string::append((char *)&local_98);
      std::__cxx11::string::append((char *)&local_98);
      std::operator+(&local_78,"Some required settings in the configuration file were missing:\n",
                     &local_98);
      cmSystemTools::Error(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      iVar6 = 4;
    }
    else {
      if ((this->CTestRoot)._M_string_length == 0) {
        cmsys::SystemTools::GetFilenamePath(&local_98,local_50);
        std::__cxx11::string::operator=(local_58,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_40 != (char *)0x0) {
        dVar4 = atof(local_40);
        this->MinimumInterval = dVar4 * 60.0;
      }
      if (local_48 != (char *)0x0) {
        dVar4 = atof(local_48);
        this->ContinuousDuration = dVar4 * 60.0;
      }
      UpdateElapsedTime(this);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int cmCTestScriptHandler::ExtractVariables()
{
  // Temporary variables
  const char* minInterval;
  const char* contDuration;

  this->SourceDir =
    this->Makefile->GetSafeDefinition("CTEST_SOURCE_DIRECTORY");
  this->BinaryDir =
    this->Makefile->GetSafeDefinition("CTEST_BINARY_DIRECTORY");

  // add in translations for src and bin
  cmSystemTools::AddKeepPath(this->SourceDir);
  cmSystemTools::AddKeepPath(this->BinaryDir);

  this->CTestCmd = this->Makefile->GetSafeDefinition("CTEST_COMMAND");
  this->CVSCheckOut = this->Makefile->GetSafeDefinition("CTEST_CVS_CHECKOUT");
  this->CTestRoot = this->Makefile->GetSafeDefinition("CTEST_DASHBOARD_ROOT");
  this->UpdateCmd = this->Makefile->GetSafeDefinition("CTEST_UPDATE_COMMAND");
  if (this->UpdateCmd.empty()) {
    this->UpdateCmd = this->Makefile->GetSafeDefinition("CTEST_CVS_COMMAND");
  }
  this->CTestEnv = this->Makefile->GetSafeDefinition("CTEST_ENVIRONMENT");
  this->InitialCache =
    this->Makefile->GetSafeDefinition("CTEST_INITIAL_CACHE");
  this->CMakeCmd = this->Makefile->GetSafeDefinition("CTEST_CMAKE_COMMAND");
  this->CMOutFile =
    this->Makefile->GetSafeDefinition("CTEST_CMAKE_OUTPUT_FILE_NAME");

  this->Backup = this->Makefile->IsOn("CTEST_BACKUP_AND_RESTORE");
  this->EmptyBinDir =
    this->Makefile->IsOn("CTEST_START_WITH_EMPTY_BINARY_DIRECTORY");
  this->EmptyBinDirOnce =
    this->Makefile->IsOn("CTEST_START_WITH_EMPTY_BINARY_DIRECTORY_ONCE");

  minInterval =
    this->Makefile->GetDefinition("CTEST_CONTINUOUS_MINIMUM_INTERVAL");
  contDuration = this->Makefile->GetDefinition("CTEST_CONTINUOUS_DURATION");

  char updateVar[40];
  int i;
  for (i = 1; i < 10; ++i) {
    sprintf(updateVar, "CTEST_EXTRA_UPDATES_%i", i);
    const char* updateVal = this->Makefile->GetDefinition(updateVar);
    if (updateVal) {
      if (this->UpdateCmd.empty()) {
        cmSystemTools::Error(
          std::string(updateVar) +
          " specified without specifying CTEST_CVS_COMMAND.");
        return 12;
      }
      this->ExtraUpdates.emplace_back(updateVal);
    }
  }

  // in order to backup and restore we also must have the cvs root
  if (this->Backup && this->CVSCheckOut.empty()) {
    cmSystemTools::Error(
      "Backup was requested without specifying CTEST_CVS_CHECKOUT.");
    return 3;
  }

  // make sure the required info is here
  if (this->SourceDir.empty() || this->BinaryDir.empty() ||
      this->CTestCmd.empty()) {
    std::string msg = "CTEST_SOURCE_DIRECTORY = ";
    msg += (!this->SourceDir.empty()) ? this->SourceDir.c_str() : "(Null)";
    msg += "\nCTEST_BINARY_DIRECTORY = ";
    msg += (!this->BinaryDir.empty()) ? this->BinaryDir.c_str() : "(Null)";
    msg += "\nCTEST_COMMAND = ";
    msg += (!this->CTestCmd.empty()) ? this->CTestCmd.c_str() : "(Null)";
    cmSystemTools::Error(
      "Some required settings in the configuration file were missing:\n" +
      msg);
    return 4;
  }

  // if the dashboard root isn't specified then we can compute it from the
  // this->SourceDir
  if (this->CTestRoot.empty()) {
    this->CTestRoot = cmSystemTools::GetFilenamePath(this->SourceDir);
  }

  // the script may override the minimum continuous interval
  if (minInterval) {
    this->MinimumInterval = 60 * atof(minInterval);
  }
  if (contDuration) {
    this->ContinuousDuration = 60.0 * atof(contDuration);
  }

  this->UpdateElapsedTime();

  return 0;
}